

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode
          (ImmediateBrokenPromiseNode *this,Exception *exception)

{
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0042e910;
  Exception::Exception(&this->exception,exception);
  return;
}

Assistant:

ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode(Exception&& exception)
    : exception(kj::mv(exception)) {}